

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int str_format(lua_State *L)

{
  char cVar1;
  ushort *puVar2;
  StkId pTVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  void *pvVar8;
  ushort **ppuVar9;
  size_t sVar10;
  TValue *pTVar11;
  ulong uVar12;
  size_t l_00;
  byte *pbVar13;
  char *pcVar14;
  byte *pbVar15;
  bool bVar16;
  lua_Number lVar17;
  char form [18];
  size_t l;
  size_t sfl;
  char buff [512];
  luaL_Buffer b;
  undefined8 uStack_2290;
  char local_2288 [24];
  ulong local_2270;
  char *local_2268;
  byte *local_2260;
  ulong local_2258;
  size_t local_2250;
  size_t local_2248 [64];
  luaL_Buffer local_2048;
  
  local_2270 = (long)L->top - (long)L->base;
  uStack_2290 = (code *)0x111d39;
  pbVar7 = (byte *)luaL_checklstring(L,1,&local_2250);
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2048.L = L;
  if (0 < (long)local_2250) {
    local_2270 = local_2270 >> 4;
    pbVar15 = pbVar7 + local_2250;
    iVar6 = 1;
    local_2260 = pbVar15;
    do {
      if (*pbVar7 != 0x25) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_2290 = (code *)0x111dd5;
          iVar5 = emptybuffer(&local_2048);
          if (iVar5 != 0) {
            uStack_2290 = (code *)0x111de6;
            adjuststack(&local_2048);
          }
        }
        bVar4 = *pbVar7;
        pbVar7 = pbVar7 + 1;
LAB_00111deb:
        *local_2048.p = bVar4;
        local_2048.p = local_2048.p + 1;
        goto LAB_0011200e;
      }
      if (pbVar7[1] == 0x25) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_2290 = (code *)0x111da4;
          iVar5 = emptybuffer(&local_2048);
          if (iVar5 != 0) {
            uStack_2290 = (code *)0x111db5;
            adjuststack(&local_2048);
          }
        }
        bVar4 = pbVar7[1];
        pbVar7 = pbVar7 + 2;
        goto LAB_00111deb;
      }
      iVar5 = iVar6 + 1;
      if ((int)local_2270 <= iVar6) {
        uStack_2290 = (code *)0x1122b8;
        luaL_argerror(L,iVar5,"no value");
      }
      pbVar7 = pbVar7 + 1;
      bVar4 = *pbVar7;
      pbVar15 = pbVar7;
      while (bVar4 != 0) {
        uStack_2290 = (code *)0x111e34;
        pvVar8 = memchr("-+ #0",(int)(char)bVar4,6);
        if (pvVar8 == (void *)0x0) break;
        pbVar13 = pbVar15 + 1;
        pbVar15 = pbVar15 + 1;
        bVar4 = *pbVar13;
      }
      if (5 < (ulong)((long)pbVar15 - (long)pbVar7)) {
        pcVar14 = "invalid format (repeated flags)";
LAB_001122ce:
        uStack_2290 = (code *)0x1122d5;
        luaL_error(L,pcVar14);
      }
      uStack_2290 = (code *)0x111e59;
      ppuVar9 = __ctype_b_loc();
      puVar2 = *ppuVar9;
      uVar12 = (ulong)(puVar2[*pbVar15] >> 0xb & 1);
      pbVar15 = pbVar15 + ((puVar2[pbVar15[uVar12]] >> 0xb & 1) != 0) + uVar12;
      if (*pbVar15 == 0x2e) {
        bVar16 = (*(byte *)((long)puVar2 + (ulong)pbVar15[1] * 2 + 1) & 8) == 0;
        pbVar13 = pbVar15 + 2;
        if (bVar16) {
          pbVar13 = pbVar15 + 1;
        }
        pbVar15 = pbVar13 + ((puVar2[pbVar15[2 - (ulong)bVar16]] >> 0xb & 1) != 0);
      }
      if ((*(byte *)((long)puVar2 + (ulong)*pbVar15 * 2 + 1) & 8) != 0) {
        pcVar14 = "invalid format (width or precision too long)";
        goto LAB_001122ce;
      }
      local_2288[0] = '%';
      uStack_2290 = (code *)0x111ee5;
      strncpy(local_2288 + 1,(char *)pbVar7,(size_t)(pbVar15 + (1 - (long)pbVar7)));
      pbVar15[(long)(local_2288 + (2 - (long)pbVar7))] = 0;
      bVar4 = *pbVar15;
      if (bVar4 < 99) {
        if ((bVar4 != 0x45) && (bVar4 != 0x47)) {
          if (bVar4 != 0x58) goto switchD_00111f17_caseD_68;
          goto switchD_00111f17_caseD_6f;
        }
switchD_00111f17_caseD_65:
        uStack_2290 = (code *)0x111fc6;
        luaL_checknumber(L,iVar5);
        uStack_2290 = (code *)0x111fd3;
        sprintf((char *)local_2248,local_2288);
        goto LAB_00111fdb;
      }
      switch(bVar4) {
      case 99:
        uStack_2290 = (code *)0x11220e;
        lVar17 = luaL_checknumber(L,iVar5);
        uStack_2290 = (code *)0x11221f;
        sprintf((char *)local_2248,local_2288,(ulong)(uint)(int)lVar17);
        goto LAB_00111fdb;
      case 100:
      case 0x69:
        uStack_2290 = (code *)0x111f24;
        sVar10 = strlen(local_2288);
        cVar1 = local_2288[sVar10 - 1];
        (local_2288 + (sVar10 - 1))[0] = 'l';
        (local_2288 + (sVar10 - 1))[1] = '\0';
        local_2288[sVar10] = cVar1;
        local_2288[sVar10 + 1] = '\0';
        uStack_2290 = (code *)0x111f42;
        lVar17 = luaL_checknumber(L,iVar5);
        uVar12 = (ulong)lVar17;
        goto LAB_00111fac;
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_00111f17_caseD_65;
      default:
switchD_00111f17_caseD_68:
        uStack_2290 = gmatch;
        luaL_error(L,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)(char)bVar4);
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_00111f17_caseD_6f:
        uStack_2290 = (code *)0x111f6f;
        sVar10 = strlen(local_2288);
        cVar1 = local_2288[sVar10 - 1];
        (local_2288 + (sVar10 - 1))[0] = 'l';
        (local_2288 + (sVar10 - 1))[1] = '\0';
        local_2288[sVar10] = cVar1;
        local_2288[sVar10 + 1] = '\0';
        uStack_2290 = (code *)0x111f8d;
        lVar17 = luaL_checknumber(L,iVar5);
        uVar12 = (long)(lVar17 - 9.223372036854776e+18) & (long)lVar17 >> 0x3f | (long)lVar17;
LAB_00111fac:
        uStack_2290 = (code *)0x111fb9;
        sprintf((char *)local_2248,local_2288,uVar12);
LAB_00111fdb:
        uStack_2290 = (code *)0x111fe3;
        sVar10 = strlen((char *)local_2248);
        uStack_2290 = (code *)0x111ff6;
        luaL_addlstring(&local_2048,(char *)local_2248,sVar10);
        break;
      case 0x71:
        uStack_2290 = (code *)0x11202a;
        pbVar7 = (byte *)luaL_checklstring(L,iVar5,local_2248);
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_2290 = (code *)0x11204c;
          iVar6 = emptybuffer(&local_2048);
          if (iVar6 != 0) {
            uStack_2290 = (code *)0x11205d;
            adjuststack(&local_2048);
          }
        }
        *local_2048.p = 0x22;
        local_2048.p = local_2048.p + 1;
        while (bVar16 = local_2248[0] != 0, local_2248[0] = local_2248[0] - 1, bVar16) {
          bVar4 = *pbVar7;
          if (bVar4 < 0xd) {
            if (bVar4 == 0) {
              l_00 = 4;
              pcVar14 = "\\000";
              goto LAB_00112155;
            }
            if (bVar4 == 10) goto LAB_001120aa;
LAB_001120e9:
            if (&stack0xffffffffffffffd0 <= local_2048.p) {
              uStack_2290 = (code *)0x112100;
              iVar6 = emptybuffer(&local_2048);
              if (iVar6 != 0) {
                uStack_2290 = (code *)0x112111;
                adjuststack(&local_2048);
              }
            }
            *local_2048.p = *pbVar7;
            local_2048.p = local_2048.p + 1;
          }
          else {
            if (bVar4 != 0xd) {
              if ((bVar4 == 0x5c) || (bVar4 == 0x22)) {
LAB_001120aa:
                if (&stack0xffffffffffffffd0 <= local_2048.p) {
                  uStack_2290 = (code *)0x1120c1;
                  iVar6 = emptybuffer(&local_2048);
                  if (iVar6 != 0) {
                    uStack_2290 = (code *)0x1120d2;
                    adjuststack(&local_2048);
                  }
                }
                *local_2048.p = 0x5c;
                local_2048.p = local_2048.p + 1;
              }
              goto LAB_001120e9;
            }
            l_00 = 2;
            pcVar14 = "\\r";
LAB_00112155:
            uStack_2290 = (code *)0x11215a;
            luaL_addlstring(&local_2048,pcVar14,l_00);
          }
          pbVar7 = pbVar7 + 1;
        }
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_2290 = (code *)0x112179;
          iVar6 = emptybuffer(&local_2048);
          if (iVar6 != 0) {
            uStack_2290 = (code *)0x11218a;
            adjuststack(&local_2048);
          }
        }
        *local_2048.p = 0x22;
        local_2048.p = local_2048.p + 1;
        break;
      case 0x73:
        uStack_2290 = (code *)0x1121bb;
        local_2268 = luaL_checklstring(L,iVar5,&local_2258);
        uStack_2290 = (code *)0x1121cd;
        pcVar14 = strchr(local_2288,0x2e);
        if (local_2258 < 100 || pcVar14 != (char *)0x0) {
          uStack_2290 = (code *)0x1121fc;
          sprintf((char *)local_2248,local_2288,local_2268);
          goto LAB_00111fdb;
        }
        uStack_2290 = (code *)0x11222f;
        pTVar11 = index2adr(L,iVar5);
        pTVar3 = L->top;
        pTVar3->value = pTVar11->value;
        pTVar3->tt = pTVar11->tt;
        L->top = L->top + 1;
        uStack_2290 = (code *)0x112251;
        luaL_addvalue(&local_2048);
      }
      pbVar7 = pbVar15 + 1;
      pbVar15 = local_2260;
      iVar6 = iVar5;
LAB_0011200e:
    } while (pbVar7 < pbVar15);
  }
  uStack_2290 = (code *)0x112278;
  emptybuffer(&local_2048);
  uStack_2290 = (code *)0x112284;
  lua_concat(local_2048.L,local_2048.lvl);
  return 1;
}

Assistant:

static int str_format(lua_State*L){
int top=lua_gettop(L);
int arg=1;
size_t sfl;
const char*strfrmt=luaL_checklstring(L,arg,&sfl);
const char*strfrmt_end=strfrmt+sfl;
luaL_Buffer b;
luaL_buffinit(L,&b);
while(strfrmt<strfrmt_end){
if(*strfrmt!='%')
luaL_addchar(&b,*strfrmt++);
else if(*++strfrmt=='%')
luaL_addchar(&b,*strfrmt++);
else{
char form[(sizeof("-+ #0")+sizeof("l")+10)];
char buff[512];
if(++arg>top)
luaL_argerror(L,arg,"no value");
strfrmt=scanformat(L,strfrmt,form);
switch(*strfrmt++){
case'c':{
sprintf(buff,form,(int)luaL_checknumber(L,arg));
break;
}
case'd':case'i':{
addintlen(form);
sprintf(buff,form,(long)luaL_checknumber(L,arg));
break;
}
case'o':case'u':case'x':case'X':{
addintlen(form);
sprintf(buff,form,(unsigned long)luaL_checknumber(L,arg));
break;
}
case'e':case'E':case'f':
case'g':case'G':{
sprintf(buff,form,(double)luaL_checknumber(L,arg));
break;
}
case'q':{
addquoted(L,&b,arg);
continue;
}
case's':{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
if(!strchr(form,'.')&&l>=100){
lua_pushvalue(L,arg);
luaL_addvalue(&b);
continue;
}
else{
sprintf(buff,form,s);
break;
}
}
default:{
return luaL_error(L,"invalid option "LUA_QL("%%%c")" to "
LUA_QL("format"),*(strfrmt-1));
}
}
luaL_addlstring(&b,buff,strlen(buff));
}
}
luaL_pushresult(&b);
return 1;
}